

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string *in_stack_ffffffffffffeaf0;
  allocator<char> *in_stack_ffffffffffffeb00;
  char *in_stack_ffffffffffffeb08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb10;
  TPZGeoBlend<pzgeom::TPZGeoTetrahedra> *in_stack_ffffffffffffeb20;
  TPZGeoBlend<pzgeom::TPZGeoTetrahedra> *in_stack_ffffffffffffeb60;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00);
  uVar1 = Hash(in_stack_ffffffffffffeaf0);
  iVar2 = TPZGeoEl::ClassId((TPZGeoEl *)0x16f59e6);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::TPZGeoBlend(in_stack_ffffffffffffeb60);
  iVar3 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::ClassId(in_stack_ffffffffffffeb20);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::~TPZGeoBlend
            ((TPZGeoBlend<pzgeom::TPZGeoTetrahedra> *)0x16f5a33);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}